

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3b8fd3::QDynamicBufferResourceRoot::~QDynamicBufferResourceRoot
          (QDynamicBufferResourceRoot *this)

{
  QDynamicBufferResourceRoot *in_RDI;
  
  ~QDynamicBufferResourceRoot(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

inline ~QDynamicBufferResourceRoot() { }